

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjIterLookupTable::get_cur_entry(CVmObjIterLookupTable *this,vm_val_t *valp,vm_val_t *keyp)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  uint uVar5;
  ulong uVar6;
  vm_val_t coll;
  vm_val_t vStack_28;
  
  get_coll_val(this,&vStack_28);
  uVar1 = *(ushort *)((this->super_CVmObjIter).super_CVmObject.ext_ + 5);
  if (uVar1 != 0) {
    puVar3 = *(uint **)((long)&G_obj_table_X.pages_[vStack_28.val.obj >> 0xc]
                               [vStack_28.val.obj & 0xfff].ptr_ + 8);
    if ((uint)uVar1 <= puVar3[1]) {
      uVar2 = *puVar3;
      uVar6 = (ulong)(uint)uVar1;
      if (puVar3[(ulong)uVar2 * 2 + uVar6 * 10 + -2] != 0xd) {
        if (valp != (vm_val_t *)0x0) {
          uVar5 = (puVar3 + (ulong)uVar2 * 2 + uVar6 * 10 + 2)[1];
          aVar4 = *(anon_union_8_8_cb74652f_for_val *)(puVar3 + (ulong)uVar2 * 2 + uVar6 * 10 + 4);
          valp->typ = (puVar3 + (ulong)uVar2 * 2 + uVar6 * 10 + 2)[0];
          *(uint *)&valp->field_0x4 = uVar5;
          valp->val = aVar4;
        }
        if (keyp != (vm_val_t *)0x0) {
          aVar4 = *(anon_union_8_8_cb74652f_for_val *)(puVar3 + (ulong)uVar2 * 2 + uVar6 * 10);
          *(anon_union_8_8_cb74652f_for_val *)keyp =
               ((anon_union_8_8_cb74652f_for_val *)(puVar3 + (ulong)uVar2 * 2 + uVar6 * 10))[-1];
          keyp->val = aVar4;
        }
        return;
      }
    }
  }
  err_throw(0x7eb);
}

Assistant:

void CVmObjIterLookupTable::get_cur_entry(VMG_ vm_val_t *valp,
                                          vm_val_t *keyp) const
{
    uint entry;
    vm_val_t coll;
    CVmObjLookupTable *ltab;
    vm_lookup_val *entryp;

    /* get my collection object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* make sure the index is in range */
    entry = get_entry_index();
    if (entry < 1 || entry > ltab->get_entry_count())
        err_throw(VMERR_OUT_OF_RANGE);

    /* translate our 1-based index to an entry pointer */
    entryp = ltab->get_ext()->idx_to_val(entry - 1);

    /* if the current entry has been deleted, we have no valid current item */
    if (entryp->key.typ == VM_EMPTY)
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve this entry's value and key for the caller, as desired */
    if (valp != 0)
        *valp = entryp->val;
    if (keyp != 0)
        *keyp = entryp->key;
}